

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseExtensions
          (Parser *this,DescriptorProto *message,LocationRecorder *extensions_location)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  void **ppvVar4;
  Tokenizer *pTVar5;
  DescriptorProto *pDVar6;
  bool bVar7;
  DescriptorProto_ExtensionRange *descriptor;
  int end;
  int start;
  LocationRecorder start_location;
  Token start_token;
  LocationRecorder location;
  int local_a8;
  int local_a4;
  DescriptorProto *local_a0;
  LocationRecorder local_98;
  LocationRecorder *local_88;
  RepeatedPtrFieldBase *local_80;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined8 local_50;
  int local_48;
  LocationRecorder local_40;
  
  local_88 = extensions_location;
  bVar7 = Consume(this,"extensions");
  if (bVar7) {
    local_80 = &(message->extension_range_).super_RepeatedPtrFieldBase;
    local_a0 = message;
    do {
      iVar2 = (local_a0->extension_range_).super_RepeatedPtrFieldBase.current_size_;
      LocationRecorder::Init(&local_40,local_88);
      pDVar6 = local_a0;
      LocationRecorder::AddPath(&local_40,iVar2);
      iVar2 = (pDVar6->extension_range_).super_RepeatedPtrFieldBase.current_size_;
      iVar3 = (pDVar6->extension_range_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar3) {
        ppvVar4 = (pDVar6->extension_range_).super_RepeatedPtrFieldBase.elements_;
        (pDVar6->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        descriptor = (DescriptorProto_ExtensionRange *)ppvVar4[iVar2];
      }
      else {
        iVar2 = (pDVar6->extension_range_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar3 == iVar2) {
          internal::RepeatedPtrFieldBase::Reserve(local_80,iVar2 + 1);
        }
        piVar1 = &(local_a0->extension_range_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        descriptor = internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>
                     ::New();
        ppvVar4 = (local_a0->extension_range_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (local_a0->extension_range_).super_RepeatedPtrFieldBase.current_size_;
        (local_a0->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar4[iVar2] = descriptor;
      }
      LocationRecorder::RecordLegacyLocation(&local_40,&descriptor->super_Message,NUMBER);
      local_68 = 0;
      local_60._M_local_buf[0] = '\0';
      local_70._M_p = (pointer)&local_60;
      LocationRecorder::Init(&local_98,&local_40);
      LocationRecorder::AddPath(&local_98,1);
      pTVar5 = this->input_;
      local_78._0_4_ = (pTVar5->current_).type;
      std::__cxx11::string::_M_assign((string *)&local_70);
      local_48 = (pTVar5->current_).end_column;
      local_50._0_4_ = (pTVar5->current_).line;
      local_50._4_4_ = (pTVar5->current_).column;
      bVar7 = ConsumeInteger(this,&local_a4,"Expected field number range.");
      LocationRecorder::~LocationRecorder(&local_98);
      if (bVar7) {
        bVar7 = TryConsume(this,"to");
        if (bVar7) {
          LocationRecorder::Init(&local_98,&local_40);
          LocationRecorder::AddPath(&local_98,2);
          bVar7 = TryConsume(this,"max");
          if (bVar7) {
            local_a8 = -2;
          }
          else {
            bVar7 = ConsumeInteger(this,&local_a8,"Expected integer.");
            if (!bVar7) {
              LocationRecorder::~LocationRecorder(&local_98);
              bVar7 = false;
              goto LAB_0021b36d;
            }
          }
        }
        else {
          LocationRecorder::Init(&local_98,&local_40);
          LocationRecorder::AddPath(&local_98,2);
          LocationRecorder::StartAt(&local_98,(Token *)local_78);
          LocationRecorder::EndAt(&local_98,(Token *)local_78);
          local_a8 = local_a4;
        }
        LocationRecorder::~LocationRecorder(&local_98);
        local_a8 = local_a8 + 1;
        descriptor->start_ = local_a4;
        descriptor->_has_bits_[0] = descriptor->_has_bits_[0] | 3;
        descriptor->end_ = local_a8;
        bVar7 = true;
      }
      else {
        bVar7 = false;
      }
LAB_0021b36d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,
                        CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1)
        ;
      }
      LocationRecorder::~LocationRecorder(&local_40);
      if (!bVar7) goto LAB_0021b3b7;
      bVar7 = TryConsume(this,",");
    } while (bVar7);
    bVar7 = ConsumeEndOfDeclaration(this,";",local_88);
  }
  else {
LAB_0021b3b7:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool Parser::ParseExtensions(DescriptorProto* message,
                             const LocationRecorder& extensions_location) {
  // Parse the declaration.
  DO(Consume("extensions"));

  do {
    // Note that kExtensionRangeFieldNumber was already pushed by the parent.
    LocationRecorder location(extensions_location,
                              message->extension_range_size());

    DescriptorProto::ExtensionRange* range = message->add_extension_range();
    location.RecordLegacyLocation(
        range, DescriptorPool::ErrorCollector::NUMBER);

    int start, end;
    io::Tokenizer::Token start_token;

    {
      LocationRecorder start_location(
          location, DescriptorProto::ExtensionRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeInteger(&start, "Expected field number range."));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // Set to the sentinel value - 1 since we increment the value below.
        // The actual value of the end of the range should be set with
        // AdjustExtensionRangesWithMaxEndNumber.
        end = kMaxExtensionRangeSentinel - 1;
      } else {
        DO(ConsumeInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    // Users like to specify inclusive ranges, but in code we like the end
    // number to be exclusive.
    ++end;

    range->set_start(start);
    range->set_end(end);
  } while (TryConsume(","));

  DO(ConsumeEndOfDeclaration(";", &extensions_location));
  return true;
}